

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void codeINTerm(Parse *pParse,WhereTerm *pTerm,WhereLevel *pLevel,int iEq,int bRev,int iTarget)

{
  long lVar1;
  Expr *pEVar2;
  sqlite3 *psVar3;
  u8 uVar4;
  int iVar5;
  InLoop *pIVar6;
  int in_ECX;
  WhereLevel *in_RDX;
  WhereTerm *in_RSI;
  Parse *in_RDI;
  uint in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  int iCol;
  int iOut;
  int iMap;
  int n;
  sqlite3 *db;
  Expr *pExpr;
  int *aiMap;
  int nEq;
  int i;
  Vdbe *v;
  WhereLoop *pLoop;
  InLoop *pIn;
  int eType;
  Expr *pX;
  int iTab;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  sqlite3 *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff7c;
  void *local_70;
  int iVar7;
  int iVar8;
  WhereLoop *pWVar9;
  int local_44;
  Expr *local_40;
  uint local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pEVar2 = in_RSI->pExpr;
  local_44 = 5;
  pWVar9 = in_RDX->pWLoop;
  iVar7 = 0;
  local_70 = (void *)0x0;
  local_30 = in_R8D;
  if ((((pWVar9->wsFlags & 0x400) == 0) && ((pWVar9->u).btree.pIndex != (Index *)0x0)) &&
     (((pWVar9->u).btree.pIndex)->aSortOrder[in_ECX] != '\0')) {
    local_30 = (uint)((in_R8D != 0 ^ 0xffU) & 1);
  }
  iVar8 = 0;
  do {
    iVar5 = in_ECX;
    if (in_ECX <= iVar8) {
      for (; iVar5 < (int)(uint)pWVar9->nLTerm; iVar5 = iVar5 + 1) {
        if (pWVar9->aLTerm[iVar5]->pExpr == pEVar2) {
          iVar7 = iVar7 + 1;
        }
      }
      if (((pEVar2->flags & 0x1000) == 0) || (((pEVar2->x).pSelect)->pEList->nExpr == 1)) {
        local_44 = sqlite3FindInIndex(_nEq,(Expr *)aiMap,pExpr._4_4_,(int *)db,_iMap,_iCol);
        local_40 = pEVar2;
      }
      else {
        local_40 = in_RSI->pExpr;
        if ((local_40->iTable == 0) || ((local_40->flags & 0x2000000) == 0)) {
          psVar3 = in_RDI->db;
          removeUnindexableInClauseTerms
                    ((Parse *)&DAT_aaaaaaaaaaaaaaaa,(int)((ulong)pWVar9 >> 0x20),
                     (WhereLoop *)in_RDI->pVdbe,(Expr *)CONCAT44(iVar5,iVar7));
          if (psVar3->mallocFailed == '\0') {
            local_70 = sqlite3DbMallocZero((sqlite3 *)
                                           CONCAT44(in_stack_ffffffffffffff64,
                                                    in_stack_ffffffffffffff60),
                                           CONCAT44(in_stack_ffffffffffffff5c,
                                                    in_stack_ffffffffffffff58));
            local_44 = sqlite3FindInIndex(_nEq,(Expr *)aiMap,pExpr._4_4_,(int *)db,_iMap,_iCol);
            local_40->iTable = 0;
          }
          sqlite3ExprDelete((sqlite3 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                            ,(Expr *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        }
        else {
          in_stack_ffffffffffffff7c = sqlite3ExprVectorSize(pEVar2->pLeft);
          in_stack_ffffffffffffff68 = in_RDI->db;
          in_stack_ffffffffffffff64 = in_stack_ffffffffffffff7c;
          if (in_stack_ffffffffffffff7c < iVar7) {
            in_stack_ffffffffffffff64 = iVar7;
          }
          local_70 = sqlite3DbMallocZero((sqlite3 *)
                                         CONCAT44(in_stack_ffffffffffffff64,
                                                  in_stack_ffffffffffffff60),
                                         CONCAT44(in_stack_ffffffffffffff5c,
                                                  in_stack_ffffffffffffff58));
          local_44 = sqlite3FindInIndex(_nEq,(Expr *)aiMap,pExpr._4_4_,(int *)db,_iMap,_iCol);
        }
      }
      if (local_44 == 4) {
        local_30 = (uint)((local_30 != 0 ^ 0xffU) & 1);
      }
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,0);
      pWVar9->wsFlags = pWVar9->wsFlags | 0x800;
      if ((in_RDX->u).in.nIn == 0) {
        iVar8 = sqlite3VdbeMakeLabel(in_RDI);
        in_RDX->addrNxt = iVar8;
      }
      if ((0 < in_ECX) && ((pWVar9->wsFlags & 0x100000) == 0)) {
        pWVar9->wsFlags = pWVar9->wsFlags | 0x40000;
      }
      iVar8 = (in_RDX->u).in.nIn;
      (in_RDX->u).in.nIn = iVar7 + (in_RDX->u).in.nIn;
      pIVar6 = (InLoop *)
               sqlite3WhereRealloc((WhereInfo *)
                                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                   in_stack_ffffffffffffff68,
                                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      (in_RDX->u).in.aInLoop = pIVar6;
      pIVar6 = (in_RDX->u).in.aInLoop;
      if (pIVar6 == (InLoop *)0x0) {
        (in_RDX->u).in.nIn = 0;
      }
      else {
        iVar7 = 0;
        pIVar6 = pIVar6 + iVar8;
        iVar8 = in_ECX;
        while( true ) {
          iVar5 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
          if ((int)(uint)pWVar9->nLTerm <= iVar8) break;
          if (pWVar9->aLTerm[iVar8]->pExpr == local_40) {
            in_stack_ffffffffffffff74 = (in_R9D + iVar8) - in_ECX;
            if (local_44 == 1) {
              iVar5 = sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,
                                                         in_stack_ffffffffffffff60),
                                        in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,0);
              pIVar6->addrInTop = iVar5;
            }
            else {
              if (local_70 == (void *)0x0) {
                in_stack_ffffffffffffff60 = 0;
              }
              else {
                in_stack_ffffffffffffff60 = *(int *)((long)local_70 + (long)iVar7 * 4);
                iVar7 = iVar7 + 1;
              }
              in_stack_ffffffffffffff70 = in_stack_ffffffffffffff60;
              iVar5 = sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff7c,iVar7),
                                        in_stack_ffffffffffffff74,in_stack_ffffffffffffff60,iVar5,
                                        (int)in_stack_ffffffffffffff68);
              pIVar6->addrInTop = iVar5;
            }
            sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
            if (iVar8 == in_ECX) {
              pIVar6->iCur = 0;
              uVar4 = '\'';
              if (local_30 != 0) {
                uVar4 = '&';
              }
              pIVar6->eEndLoopOp = uVar4;
              if (in_ECX < 1) {
                pIVar6->nPrefix = 0;
              }
              else {
                pIVar6->iBase = in_R9D - iVar8;
                pIVar6->nPrefix = iVar8;
              }
            }
            else {
              pIVar6->eEndLoopOp = 0xbb;
            }
            pIVar6 = pIVar6 + 1;
          }
          iVar8 = iVar8 + 1;
        }
        if ((0 < in_ECX) && ((pWVar9->wsFlags & 0x100400) == 0)) {
          sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff7c,iVar7),
                            in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,iVar5,
                            (int)in_stack_ffffffffffffff68);
        }
      }
      sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
LAB_0020d517:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    if ((pWVar9->aLTerm[iVar8] != (WhereTerm *)0x0) && (pWVar9->aLTerm[iVar8]->pExpr == pEVar2)) {
      disableTerm(in_RDX,in_RSI);
      goto LAB_0020d517;
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

static SQLITE_NOINLINE void codeINTerm(
  Parse *pParse,      /* The parsing context */
  WhereTerm *pTerm,   /* The term of the WHERE clause to be coded */
  WhereLevel *pLevel, /* The level of the FROM clause we are working on */
  int iEq,            /* Index of the equality term within this level */
  int bRev,           /* True for reverse-order IN operations */
  int iTarget         /* Attempt to leave results in this register */
){
  Expr *pX = pTerm->pExpr;
  int eType = IN_INDEX_NOOP;
  int iTab;
  struct InLoop *pIn;
  WhereLoop *pLoop = pLevel->pWLoop;
  Vdbe *v = pParse->pVdbe;
  int i;
  int nEq = 0;
  int *aiMap = 0;

  if( (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
    && pLoop->u.btree.pIndex!=0
    && pLoop->u.btree.pIndex->aSortOrder[iEq]
  ){
    testcase( iEq==0 );
    testcase( bRev );
    bRev = !bRev;
  }
  assert( pX->op==TK_IN );

  for(i=0; i<iEq; i++){
    if( pLoop->aLTerm[i] && pLoop->aLTerm[i]->pExpr==pX ){
      disableTerm(pLevel, pTerm);
      return;
    }
  }
  for(i=iEq;i<pLoop->nLTerm; i++){
    assert( pLoop->aLTerm[i]!=0 );
    if( pLoop->aLTerm[i]->pExpr==pX ) nEq++;
  }

  iTab = 0;
  if( !ExprUseXSelect(pX) || pX->x.pSelect->pEList->nExpr==1 ){
    eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, 0, &iTab);
  }else{
    Expr *pExpr = pTerm->pExpr;
    if( pExpr->iTable==0 || !ExprHasProperty(pExpr, EP_Subrtn) ){
      sqlite3 *db = pParse->db;
      pX = removeUnindexableInClauseTerms(pParse, iEq, pLoop, pX);
      if( !db->mallocFailed ){
        aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*nEq);
        eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap,&iTab);
        pExpr->iTable = iTab;
      }
      sqlite3ExprDelete(db, pX);
    }else{
      int n = sqlite3ExprVectorSize(pX->pLeft);
      aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*MAX(nEq,n));
      eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap, &iTab);
    }
    pX = pExpr;
  }

  if( eType==IN_INDEX_INDEX_DESC ){
    testcase( bRev );
    bRev = !bRev;
  }
  sqlite3VdbeAddOp2(v, bRev ? OP_Last : OP_Rewind, iTab, 0);
  VdbeCoverageIf(v, bRev);
  VdbeCoverageIf(v, !bRev);

  assert( (pLoop->wsFlags & WHERE_MULTI_OR)==0 );
  pLoop->wsFlags |= WHERE_IN_ABLE;
  if( pLevel->u.in.nIn==0 ){
    pLevel->addrNxt = sqlite3VdbeMakeLabel(pParse);
  }
  if( iEq>0 && (pLoop->wsFlags & WHERE_IN_SEEKSCAN)==0 ){
    pLoop->wsFlags |= WHERE_IN_EARLYOUT;
  }

  i = pLevel->u.in.nIn;
  pLevel->u.in.nIn += nEq;
  pLevel->u.in.aInLoop =
     sqlite3WhereRealloc(pTerm->pWC->pWInfo,
                         pLevel->u.in.aInLoop,
                         sizeof(pLevel->u.in.aInLoop[0])*pLevel->u.in.nIn);
  pIn = pLevel->u.in.aInLoop;
  if( pIn ){
    int iMap = 0;               /* Index in aiMap[] */
    pIn += i;
    for(i=iEq;i<pLoop->nLTerm; i++){
      if( pLoop->aLTerm[i]->pExpr==pX ){
        int iOut = iTarget + i - iEq;
        if( eType==IN_INDEX_ROWID ){
          pIn->addrInTop = sqlite3VdbeAddOp2(v, OP_Rowid, iTab, iOut);
        }else{
          int iCol = aiMap ? aiMap[iMap++] : 0;
          pIn->addrInTop = sqlite3VdbeAddOp3(v,OP_Column,iTab, iCol, iOut);
        }
        sqlite3VdbeAddOp1(v, OP_IsNull, iOut); VdbeCoverage(v);
        if( i==iEq ){
          pIn->iCur = iTab;
          pIn->eEndLoopOp = bRev ? OP_Prev : OP_Next;
          if( iEq>0 ){
            pIn->iBase = iTarget - i;
            pIn->nPrefix = i;
          }else{
            pIn->nPrefix = 0;
          }
        }else{
          pIn->eEndLoopOp = OP_Noop;
        }
        pIn++;
      }
    }
    testcase( iEq>0
              && (pLoop->wsFlags & WHERE_IN_SEEKSCAN)==0
              && (pLoop->wsFlags & WHERE_VIRTUALTABLE)!=0 );
    if( iEq>0
     && (pLoop->wsFlags & (WHERE_IN_SEEKSCAN|WHERE_VIRTUALTABLE))==0
    ){
      sqlite3VdbeAddOp3(v, OP_SeekHit, pLevel->iIdxCur, 0, iEq);
    }
  }else{
    pLevel->u.in.nIn = 0;
  }
  sqlite3DbFree(pParse->db, aiMap);
}